

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WOZ.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::WOZ::get_track_at_position(WOZ *this,Address address)

{
  uint32_t uVar1;
  long offset_00;
  mutex *__m;
  unsigned_short *puVar2;
  size_t in_RCX;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<Storage::Disk::Track> sVar4;
  PCMSegment local_108;
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [2];
  uint16_t starting_block;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lock_guard;
  size_t number_of_bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track_contents;
  long offset;
  WOZ *this_local;
  Address address_local;
  
  offset_00 = file_offset((WOZ *)address,in_RDX);
  if (offset_00 == 0) {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr
              ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&number_of_bits);
    __m = FileHolder::get_file_access_mutex((FileHolder *)((long)address + 8));
    std::lock_guard<std::mutex>::lock_guard(&local_58,__m);
    FileHolder::seek((FileHolder *)((long)address + 8),offset_00,0);
    if (*(int *)((long)address + 0xf0) == 0) {
      FileHolder::read((FileHolder *)local_80,address.head + 8,(void *)0x19f6,in_RCX);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&number_of_bits,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      FileHolder::seek((FileHolder *)((long)address + 8),2,1);
      local_a0._30_2_ = FileHolder::get16le((FileHolder *)((long)address + 8));
      local_a0._28_2_ = 0xcfb0;
      puVar2 = std::min<unsigned_short>
                         ((unsigned_short *)(local_a0 + 0x1e),(unsigned_short *)(local_a0 + 0x1c));
      lock_guard._M_device = (mutex_type *)(ulong)*puVar2;
    }
    else {
      local_a0._26_2_ = FileHolder::get16le((FileHolder *)((long)address + 8));
      FileHolder::seek((FileHolder *)((long)address + 8),2,1);
      uVar1 = FileHolder::get32le((FileHolder *)((long)address + 8));
      lock_guard._M_device = (mutex_type *)(ulong)uVar1;
      FileHolder::seek((FileHolder *)((long)address + 8),(ulong)(ushort)local_a0._26_2_ << 9,0);
      FileHolder::read((FileHolder *)local_a0,address.head + 8,
                       (void *)((ulong)((long)&((lock_guard._M_device)->super___mutex_base)._M_mutex
                                       + 7U) >> 3),in_RCX);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&number_of_bits,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_58);
    PCMSegment::PCMSegment
              (&local_108,(size_t)lock_guard._M_device,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&number_of_bits);
    std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment>((PCMSegment *)local_b0);
    std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
              ((shared_ptr<Storage::Disk::Track> *)this,
               (shared_ptr<Storage::Disk::PCMTrack> *)local_b0);
    std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
              ((shared_ptr<Storage::Disk::PCMTrack> *)local_b0);
    PCMSegment::~PCMSegment(&local_108);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&number_of_bits);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> WOZ::get_track_at_position(Track::Address address) {
	const long offset = file_offset(address);
	if(offset == NoSuchTrack) {
		return nullptr;
	}

	// Seek to the real track.
	std::vector<uint8_t> track_contents;
	size_t number_of_bits;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(offset, SEEK_SET);

		switch(type_) {
			case Type::WOZ1:
				// In WOZ 1, a track is up to 6646 bytes of data, followed by a two-byte record of the
				// number of bytes that actually had data in them, then a two-byte count of the number
				// of bits that were used. Other information follows but is not intended for emulation.
				track_contents = file_.read(6646);
				file_.seek(2, SEEK_CUR);
				number_of_bits = std::min(file_.get16le(), uint16_t(6646*8));
			break;

			default:
			case Type::WOZ2: {
				// In WOZ 2 an extra level of indirection allows for variable track sizes.
				const uint16_t starting_block = file_.get16le();
				file_.seek(2, SEEK_CUR);	// Skip the block count; the amount of data to read is implied by the number of bits.
				number_of_bits = file_.get32le();

				file_.seek(starting_block * 512, SEEK_SET);
				track_contents = file_.read((number_of_bits + 7) >> 3);
			} break;
		}
	}

	return std::make_shared<PCMTrack>(PCMSegment(number_of_bits, track_contents));
}